

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleFanSet(X3DImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FIReader *pFVar3;
  char *pcVar4;
  CX3DImporter_NodeElement *pCVar5;
  iterator iVar6;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar7;
  CX3DImporter_NodeElement *pCVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var13;
  runtime_error *prVar14;
  string *psVar15;
  int *piVar16;
  ulong uVar17;
  int iVar18;
  char *__end;
  string an;
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> fanCount;
  string def;
  string use;
  bool local_cb;
  bool local_ca;
  bool local_c9;
  string local_c0;
  vector<int,_std::allocator<int>_> *local_a0;
  CX3DImporter_NodeElement *local_98;
  allocator local_89;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98 = (CX3DImporter_NodeElement *)0x0;
  uVar10 = (*(((this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
             super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar10 < 1) {
    local_c9 = true;
    local_ca = true;
    local_cb = true;
    bVar9 = true;
  }
  else {
    uVar17 = 0;
    bVar9 = true;
    local_cb = true;
    local_ca = true;
    local_c9 = true;
    local_a0 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_a0._4_4_,uVar10);
    do {
      pFVar3 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar12 = (int)uVar17;
      iVar11 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar3,uVar17);
      std::__cxx11::string::string
                ((string *)&local_c0,(char *)CONCAT44(extraout_var,iVar11),&local_89);
      iVar11 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar11 == 0) {
        iVar11 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar11);
        psVar15 = &local_70;
LAB_0074cd71:
        pcVar4 = (char *)psVar15->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar4,(ulong)__s);
        uVar10 = (uint)local_a0;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar11 == 0) {
          iVar11 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar11);
          psVar15 = &local_50;
          goto LAB_0074cd71;
        }
        iVar11 = std::__cxx11::string::compare((char *)&local_c0);
        if (((iVar11 != 0) &&
            (iVar11 = std::__cxx11::string::compare((char *)&local_c0), iVar11 != 0)) &&
           (iVar11 = std::__cxx11::string::compare((char *)&local_c0), iVar11 != 0)) {
          iVar11 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar11 == 0) {
            bVar9 = XML_ReadNode_GetAttrVal_AsBool(this,iVar12);
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar11 == 0) {
              local_cb = XML_ReadNode_GetAttrVal_AsBool(this,iVar12);
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)&local_c0);
              if (iVar11 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,iVar12,&local_88);
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)&local_c0);
                if (iVar11 == 0) {
                  local_c9 = XML_ReadNode_GetAttrVal_AsBool(this,iVar12);
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)&local_c0);
                  if (iVar11 == 0) {
                    local_ca = XML_ReadNode_GetAttrVal_AsBool(this,iVar12);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_c0);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      uVar17 = (ulong)(iVar12 + 1U);
    } while (uVar10 != iVar12 + 1U);
  }
  if (local_50._M_string_length == 0) {
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"TriangleFanSet must contain not empty \"fanCount\" attribute."
                 ,"");
      std::runtime_error::runtime_error(prVar14,(string *)&local_c0);
      *(undefined ***)prVar14 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_98 = (CX3DImporter_NodeElement *)operator_new(0xd8);
    pCVar5 = this->NodeElement_Cur;
    local_98->Type = ENET_TriangleFanSet;
    (local_98->ID)._M_dataplus._M_p = (pointer)&(local_98->ID).field_2;
    (local_98->ID)._M_string_length = 0;
    (local_98->ID).field_2._M_local_buf[0] = '\0';
    local_98->Parent = pCVar5;
    (local_98->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98->Child;
    (local_98->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98->Child;
    (local_98->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_98[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_98[1].Type = 0;
    *(CX3DImporter_NodeElement **)&local_98[1].Type = local_98 + 1;
    local_98[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_98 + 1);
    local_98[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_98[1].ID._M_string_length = 0;
    local_98[1].ID.field_2._M_local_buf[0] = '\x01';
    local_98->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Set_009dc998;
    *(undefined8 *)((long)&local_98[1].ID.field_2 + 8) = 0;
    local_98[1].Parent = (CX3DImporter_NodeElement *)0x0;
    local_98[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_98[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_98[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_98[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_98[2].Type = 0;
    local_98[2].ID._M_dataplus._M_p = (pointer)0x0;
    local_98[2].ID._M_string_length = 0;
    local_98[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&local_98[2].ID.field_2 + 8) = 0;
    local_98[2].Parent = (CX3DImporter_NodeElement *)0x0;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_98->ID);
    }
    pCVar8 = local_98;
    local_98[1].ID.field_2._M_local_buf[1] = bVar9;
    local_98[1].ID.field_2._M_local_buf[2] = local_cb;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&local_98[2].ID.field_2,&local_88);
    pCVar8[1].ID.field_2._M_local_buf[3] = local_c9;
    pCVar8[1].ID.field_2._M_local_buf[0] = local_ca;
    pCVar5 = *(CX3DImporter_NodeElement **)((long)&pCVar8[1].ID.field_2 + 8);
    if (pCVar8[1].Parent != pCVar5) {
      pCVar8[1].Parent = pCVar5;
    }
    piVar16 = *(int **)&pCVar8[2].ID.field_2;
    if (piVar16 != *(int **)((long)&pCVar8[2].ID.field_2 + 8)) {
      local_a0 = (vector<int,_std::allocator<int>_> *)
                 (&pCVar8[1].ID.field_2._M_allocated_capacity + 1);
      iVar12 = 1;
      iVar11 = 0;
      do {
        if (*piVar16 < 3) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,
                     "TriangleFanSet. fanCount shall be greater than or equal to three.","");
          std::runtime_error::runtime_error(prVar14,(string *)&local_c0);
          *(undefined ***)prVar14 = &PTR__runtime_error_00900168;
          __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (2 < *piVar16) {
          iVar18 = 2;
          do {
            local_c0._M_dataplus._M_p._0_4_ = iVar11;
            if (bVar9 == false) {
              iVar6._M_current = (int *)pCVar8[1].Parent;
              if ((_List_node_base *)iVar6._M_current ==
                  pCVar8[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_a0,iVar6,(int *)&local_c0);
              }
              else {
                *iVar6._M_current = iVar11;
                pCVar8[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar8[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              local_c0._M_dataplus._M_p._0_4_ = iVar12 + 1;
              iVar6._M_current = (int *)pCVar8[1].Parent;
              if ((_List_node_base *)iVar6._M_current ==
                  pCVar8[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_a0,iVar6,(int *)&local_c0);
              }
              else {
                *iVar6._M_current = (int)local_c0._M_dataplus._M_p;
                pCVar8[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar8[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              iVar6._M_current = (int *)pCVar8[1].Parent;
              if ((_List_node_base *)iVar6._M_current ==
                  pCVar8[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                local_c0._M_dataplus._M_p._0_4_ = iVar12;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_a0,iVar6,(int *)&local_c0);
              }
              else {
                *iVar6._M_current = iVar12;
                pCVar8[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar8[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
            }
            else {
              iVar6._M_current = (int *)pCVar8[1].Parent;
              if ((_List_node_base *)iVar6._M_current ==
                  pCVar8[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_a0,iVar6,(int *)&local_c0);
              }
              else {
                *iVar6._M_current = iVar11;
                pCVar8[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar8[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              iVar6._M_current = (int *)pCVar8[1].Parent;
              if ((_List_node_base *)iVar6._M_current ==
                  pCVar8[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                local_c0._M_dataplus._M_p._0_4_ = iVar12;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_a0,iVar6,(int *)&local_c0);
              }
              else {
                *iVar6._M_current = iVar12;
                pCVar8[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar8[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
              local_c0._M_dataplus._M_p._0_4_ = iVar12 + 1;
              iVar6._M_current = (int *)pCVar8[1].Parent;
              if ((_List_node_base *)iVar6._M_current ==
                  pCVar8[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_a0,iVar6,(int *)&local_c0);
              }
              else {
                *iVar6._M_current = (int)local_c0._M_dataplus._M_p;
                pCVar8[1].Parent =
                     (CX3DImporter_NodeElement *)
                     ((long)&(pCVar8[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
              }
            }
            iVar12 = iVar12 + 1;
            local_c0._M_dataplus._M_p._0_4_ = 0xffffffff;
            iVar6._M_current = (int *)pCVar8[1].Parent;
            if ((_List_node_base *)iVar6._M_current ==
                pCVar8[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_next) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_a0,iVar6,(int *)&local_c0);
            }
            else {
              *iVar6._M_current = -1;
              pCVar8[1].Parent =
                   (CX3DImporter_NodeElement *)
                   ((long)&(pCVar8[1].Parent)->_vptr_CX3DImporter_NodeElement + 4);
            }
            iVar18 = iVar18 + 1;
          } while (iVar18 < *piVar16);
        }
        iVar11 = iVar12 + 1;
        iVar12 = iVar12 + 2;
        piVar16 = piVar16 + 1;
      } while (piVar16 != *(int **)((long)&pCVar8[2].ID.field_2 + 8));
    }
    iVar11 = (*(((this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar11 == '\0') {
      ParseHelper_Node_Enter(this,local_98);
      paVar2 = &local_c0.field_2;
      do {
        do {
          while( true ) {
            iVar11 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar11 == '\0') goto LAB_0074d4d4;
            iVar12 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar12 != 1) break;
            local_c0._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Color","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar11 = std::__cxx11::string::compare((char *)&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            if (iVar11 == 0) {
              ParseNode_Rendering_Color(this);
            }
            else {
              local_c0._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ColorRGBA","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar11 = std::__cxx11::string::compare((char *)&local_c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != paVar2) {
                operator_delete(local_c0._M_dataplus._M_p);
              }
              if (iVar11 == 0) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                local_c0._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Coordinate","")
                ;
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar11 = std::__cxx11::string::compare((char *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != paVar2) {
                  operator_delete(local_c0._M_dataplus._M_p);
                }
                if (iVar11 == 0) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  local_c0._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Normal","");
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar11 = std::__cxx11::string::compare((char *)&local_c0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != paVar2) {
                    operator_delete(local_c0._M_dataplus._M_p);
                  }
                  if (iVar11 == 0) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    local_c0._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_c0,"TextureCoordinate","");
                    (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar11 = std::__cxx11::string::compare((char *)&local_c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c0._M_dataplus._M_p != paVar2) {
                      operator_delete(local_c0._M_dataplus._M_p);
                    }
                    if (iVar11 == 0) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar9 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar9) {
                        local_c0._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_c0,"TriangleFanSet","");
                        XML_CheckNode_SkipUnsupported(this,&local_c0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c0._M_dataplus._M_p != paVar2) {
                          operator_delete(local_c0._M_dataplus._M_p);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar12 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar12 != 2);
        local_c0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"TriangleFanSet","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar12 = std::__cxx11::string::compare((char *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      } while (iVar12 != 0);
      if ((char)iVar11 == '\0') {
LAB_0074d4d4:
        local_c0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"TriangleFanSet","");
        Throw_CloseNotFound(this,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar5 = this->NodeElement_Cur;
      p_Var13 = (_List_node_base *)operator_new(0x18);
      p_Var13[1]._M_next = (_List_node_base *)local_98;
      std::__detail::_List_node_base::_M_hook(p_Var13);
      psVar1 = &(pCVar5->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)local_98;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    plVar7 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar9 = FindNodeElement(this,&local_50,ENET_TriangleFanSet,&local_98);
    if (!bVar9) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar5 = this->NodeElement_Cur;
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)local_98;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    plVar7 = &pCVar5->Child;
  }
  psVar1 = &(plVar7->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleFanSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> fanCount;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("fanCount", fanCount, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleFanSet, ne);
	}
	else
	{
		// check data
		if(fanCount.size() == 0) throw DeadlyImportError("TriangleFanSet must contain not empty \"fanCount\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Set(CX3DImporter_NodeElement::ENET_TriangleFanSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.VertexCount = fanCount;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
		// create CoordIdx
		size_t coord_num_first, coord_num_prev;

		ne_alias.CoordIndex.clear();
		// assign indices for first triangle
		coord_num_first = 0;
		coord_num_prev = 1;
		for(std::vector<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); ++vc_it)
		{
			if(*vc_it < 3) throw DeadlyImportError("TriangleFanSet. fanCount shall be greater than or equal to three.");

			for(int32_t vc = 2; vc < *vc_it; vc++)
			{
				if(ccw)
				{
					// 2 1
					//  0
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_first));// first vertex is a center and always is [0].
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev++));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev));
				}
				else
				{
					// 1 2
					//  0
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_first));// first vertex is a center and always is [0].
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev + 1));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev++));
				}// if(ccw) else

				ne_alias.CoordIndex.push_back(-1);// add face delimiter.
			}// for(int32_t vc = 2; vc < *vc_it; vc++)

			coord_num_prev++;// that index will be center of next fan
			coord_num_first = coord_num_prev++;// forward to next point - second point of fan
		}// for(std::list<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); vc_it++)
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleFanSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleFanSet");

			MACRO_NODECHECK_LOOPEND("TriangleFanSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}